

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  uint uVar16;
  longdouble in_ST0;
  double dVar17;
  int local_64;
  
  *pResult = 0.0;
  uVar8 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar8 == 1) {
    lVar10 = 1;
    local_64 = 1;
    pbVar13 = (byte *)z;
  }
  else {
    local_64 = 1;
    for (lVar10 = (long)(int)(3 - uVar8); lVar10 < length; lVar10 = lVar10 + 2) {
      if (z[lVar10] != '\0') {
        local_64 = -100;
        break;
      }
    }
    length = (uint)lVar10 ^ 1;
    pbVar13 = (byte *)(z + (uVar8 & 1));
    lVar10 = 2;
  }
  pbVar14 = (byte *)(z + length);
  while( true ) {
    if (pbVar14 <= pbVar13) {
      return 0;
    }
    bVar2 = *pbVar13;
    if ((""[bVar2] & 1) == 0) break;
    pbVar13 = pbVar13 + lVar10;
  }
  lVar9 = 0;
  lVar7 = 0;
  if ((bVar2 - 0x2b & 0xfd) == 0) {
    lVar7 = lVar10;
  }
  pbVar13 = pbVar13 + lVar7;
  iVar11 = 1;
  iVar6 = 0;
  iVar12 = 0;
LAB_00164beb:
  bVar5 = 1;
  iVar15 = 0;
  if (pbVar13 < pbVar14) {
    bVar3 = *pbVar13;
    if (0xfffffffffffffff5 < (ulong)bVar3 - 0x3a) {
      lVar9 = lVar9 * 10 + (long)(char)bVar3 + -0x30;
      pbVar13 = pbVar13 + lVar10;
      iVar12 = iVar12 + 1;
      if (0xcccccccccccccca < lVar9) {
        for (; (pbVar13 < pbVar14 && (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a));
            pbVar13 = pbVar13 + lVar10) {
          iVar6 = iVar6 + 1;
        }
      }
      goto LAB_00164beb;
    }
    if (bVar3 == 0x2e) {
      local_64 = local_64 + 1;
      while ((pbVar1 = pbVar13 + lVar10, pbVar1 < pbVar14 &&
             (0xfffffffffffffff5 < (ulong)*pbVar1 - 0x3a))) {
        pbVar13 = pbVar1;
        if (lVar9 < 0xccccccccccccccb) {
          lVar9 = lVar9 * 10 + (long)(char)*pbVar1 + -0x30;
          iVar6 = iVar6 + -1;
          iVar12 = iVar12 + 1;
        }
      }
      pbVar13 = pbVar13 + lVar10;
    }
    iVar15 = 0;
    if (pbVar13 < pbVar14) {
      if ((*pbVar13 | 0x20) == 0x65) {
        pbVar13 = pbVar13 + lVar10;
        local_64 = local_64 + 1;
        if (pbVar14 <= pbVar13) {
          iVar15 = 0;
          iVar11 = 1;
          bVar5 = 0;
          goto LAB_00164d2e;
        }
        iVar11 = 1;
        if (*pbVar13 == 0x2b) {
          pbVar13 = pbVar13 + lVar10;
        }
        else if (*pbVar13 == 0x2d) {
          pbVar13 = pbVar13 + lVar10;
          iVar11 = -1;
        }
        iVar15 = 0;
        bVar5 = 0;
        for (; (pbVar13 < pbVar14 && (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a));
            pbVar13 = pbVar13 + lVar10) {
          bVar4 = 9999 < iVar15;
          iVar15 = iVar15 * 10 + -0x30 + (int)(char)*pbVar13;
          if (bVar4) {
            iVar15 = 10000;
          }
          bVar5 = 1;
        }
      }
      else {
        bVar5 = 1;
        iVar15 = 0;
        iVar11 = 1;
      }
      while ((pbVar13 < pbVar14 && ((""[*pbVar13] & 1) != 0))) {
        pbVar13 = pbVar13 + lVar10;
      }
    }
  }
LAB_00164d2e:
  if (lVar9 == 0) {
    if (bVar2 == 0x2d) {
      dVar17 = -0.0;
    }
    else {
      dVar17 = 0.0;
    }
    goto LAB_00164e24;
  }
  uVar16 = iVar15 * iVar11 + iVar6;
  uVar8 = -uVar16;
  if (0 < (int)uVar16) {
    uVar8 = uVar16;
  }
  do {
    if ((int)uVar8 < 1) {
      lVar10 = -lVar9;
      if (bVar2 != 0x2d) {
        lVar10 = lVar9;
      }
      if (uVar8 == 0) {
        dVar17 = (double)lVar10;
        goto LAB_00164e24;
      }
LAB_00164def:
      sqlite3Pow10((longdouble *)(ulong)uVar8,-0x33333335);
      if ((int)uVar16 < 0) {
        in_ST0 = (longdouble)lVar10 / in_ST0;
      }
      else {
        in_ST0 = (longdouble)lVar10 * in_ST0;
      }
      dVar17 = (double)in_ST0;
LAB_00164e24:
      *pResult = dVar17;
      if ((bool)((0 < iVar12 && pbVar13 == pbVar14) & bVar5 & 0 < local_64)) {
        return local_64;
      }
      if (local_64 < 2) {
        return 0;
      }
      if (!(bool)((bVar5 | local_64 == 3) & 0 < iVar12)) {
        return 0;
      }
      return -1;
    }
    if ((int)uVar16 < 0) {
      lVar10 = lVar9 / 10;
      if (lVar9 % 10 != 0) goto LAB_00164d9a;
    }
    else {
      if (0xccccccccccccccb < lVar9) {
LAB_00164d9a:
        lVar10 = -lVar9;
        if (bVar2 != 0x2d) {
          lVar10 = lVar9;
        }
        if (0x133 < uVar8) {
          if (uVar8 < 0x156) {
            sqlite3Pow10((longdouble *)(ulong)(uVar8 - 0x134),-0x33333335);
            if ((int)uVar16 < 0) {
              dVar17 = (double)((longdouble)lVar10 / in_ST0) / 1e+308;
            }
            else {
              dVar17 = (double)((longdouble)lVar10 * in_ST0) * 1e+308;
            }
          }
          else if ((int)uVar16 < 0) {
            dVar17 = (double)((ulong)(double)lVar10 & 0x8000000000000000);
          }
          else {
            dVar17 = (double)((float)lVar10 * INFINITY);
          }
          goto LAB_00164e24;
        }
        goto LAB_00164def;
      }
      lVar10 = lVar9 * 10;
    }
    lVar9 = lVar10;
    uVar8 = uVar8 - 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_INT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}